

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

string * __thiscall
duckdb::Vector::ToString_abi_cxx11_(string *__return_storage_ptr__,Vector *this,idx_t count)

{
  FSSTPrimitives *this_00;
  vector<unsigned_char,_true> *compressed_string_len;
  char *pcVar1;
  void *duckdb_fsst_decoder;
  vector<unsigned_char,_true> *in_R9;
  idx_t iVar2;
  long lVar3;
  string *retval;
  int64_t start;
  int64_t increment;
  Value val;
  string_t compressed_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  idx_t local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  Value local_138;
  Value local_f8;
  string local_b8;
  string local_90;
  string local_70;
  string local_50;
  
  VectorTypeToString_abi_cxx11_(&local_b8,(duckdb *)(ulong)this->vector_type,(VectorType)count);
  ::std::operator+(&local_158,&local_b8," ");
  LogicalType::ToString_abi_cxx11_(&local_70,&this->type);
  ::std::operator+(&local_180,&local_158,&local_70);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138,
                   &local_180,": ");
  ::std::__cxx11::to_string(&local_90,count);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138,
                   &local_90);
  ::std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                   " = [ ");
  ::std::__cxx11::string::~string((string *)&local_f8);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_138);
  ::std::__cxx11::string::~string((string *)&local_180);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_158);
  ::std::__cxx11::string::~string((string *)&local_b8);
  switch(this->vector_type) {
  case FLAT_VECTOR:
  case DICTIONARY_VECTOR:
    for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
      GetValue(&local_f8,this,iVar2);
      Value::ToString_abi_cxx11_(&local_180,&local_f8);
      pcVar1 = ", ";
      if (count - 1 == iVar2) {
        pcVar1 = anon_var_dwarf_4bacfca + 9;
      }
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_138,&local_180,pcVar1);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_138);
      ::std::__cxx11::string::~string((string *)&local_180);
      Value::~Value(&local_f8);
    }
    break;
  case FSST_VECTOR:
    local_160 = count - 1;
    lVar3 = 0;
    for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
      local_b8._M_dataplus._M_p = *(pointer *)(this->data + lVar3);
      local_b8._M_string_length = *(ulong *)((long)(this->data + lVar3) + 8);
      this_00 = (FSSTPrimitives *)FSSTVector::GetDecoder(this);
      compressed_string_len = FSSTVector::GetDecompressBuffer(this);
      duckdb_fsst_decoder = (void *)((long)&local_b8._M_dataplus._M_p + 4);
      if ((char *)0xc < (char *)((ulong)local_b8._M_dataplus._M_p & 0xffffffff)) {
        duckdb_fsst_decoder = (void *)local_b8._M_string_length;
      }
      FSSTPrimitives::DecompressValue_abi_cxx11_
                (&local_50,this_00,duckdb_fsst_decoder,
                 (char *)((ulong)local_b8._M_dataplus._M_p & 0xffffffff),
                 (idx_t)compressed_string_len,in_R9);
      Value::Value(&local_f8,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      GetValue(&local_138,this,iVar2);
      Value::ToString_abi_cxx11_(&local_158,&local_138);
      pcVar1 = ", ";
      if (local_160 == iVar2) {
        pcVar1 = anon_var_dwarf_4bacfca + 9;
      }
      ::std::operator+(&local_180,&local_158,pcVar1);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_180);
      ::std::__cxx11::string::~string((string *)&local_158);
      Value::~Value(&local_138);
      Value::~Value(&local_f8);
      lVar3 = lVar3 + 0x10;
    }
    break;
  case CONSTANT_VECTOR:
    GetValue(&local_f8,this,0);
    Value::ToString_abi_cxx11_((string *)&local_138,&local_f8);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_138);
    Value::~Value(&local_f8);
    break;
  case SEQUENCE_VECTOR:
    SequenceVector::GetSequence(this,(int64_t *)&local_180,(int64_t *)&local_158);
    for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
      ::std::__cxx11::to_string
                ((string *)&local_138,
                 (long)(local_180._M_dataplus._M_p + (long)local_158._M_dataplus._M_p * iVar2));
      pcVar1 = ", ";
      if (count - 1 == iVar2) {
        pcVar1 = anon_var_dwarf_4bacfca + 9;
      }
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_138,pcVar1);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_f8);
      ::std::__cxx11::string::~string((string *)&local_138);
    }
    break;
  default:
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string Vector::ToString(idx_t count) const {
	string retval =
	    VectorTypeToString(GetVectorType()) + " " + GetType().ToString() + ": " + to_string(count) + " = [ ";
	switch (GetVectorType()) {
	case VectorType::FLAT_VECTOR:
	case VectorType::DICTIONARY_VECTOR:
		for (idx_t i = 0; i < count; i++) {
			retval += GetValue(i).ToString() + (i == count - 1 ? "" : ", ");
		}
		break;
	case VectorType::FSST_VECTOR: {
		for (idx_t i = 0; i < count; i++) {
			string_t compressed_string = reinterpret_cast<string_t *>(data)[i];
			auto decoder = FSSTVector::GetDecoder(*this);
			auto &decompress_buffer = FSSTVector::GetDecompressBuffer(*this);
			Value val = FSSTPrimitives::DecompressValue(decoder, compressed_string.GetData(),
			                                            compressed_string.GetSize(), decompress_buffer);
			retval += GetValue(i).ToString() + (i == count - 1 ? "" : ", ");
		}
	} break;
	case VectorType::CONSTANT_VECTOR:
		retval += GetValue(0).ToString();
		break;
	case VectorType::SEQUENCE_VECTOR: {
		int64_t start, increment;
		SequenceVector::GetSequence(*this, start, increment);
		for (idx_t i = 0; i < count; i++) {
			retval += to_string(start + increment * UnsafeNumericCast<int64_t>(i)) + (i == count - 1 ? "" : ", ");
		}
		break;
	}
	default:
		retval += "UNKNOWN VECTOR TYPE";
		break;
	}
	retval += "]";
	return retval;
}